

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1387::run(TestCase1387 *this)

{
  Builder builder_00;
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  WirePointer *pWVar3;
  Builder root2;
  Builder root;
  undefined1 in_stack_00000140 [40];
  MallocMessageBuilder builder2;
  MallocMessageBuilder builder;
  PointerBuilder local_398;
  StructBuilder local_378;
  int iStack_350;
  undefined4 uStack_34c;
  StructReader local_348;
  StructBuilder local_310;
  Builder local_2e8;
  SegmentBuilder *in_stack_fffffffffffffd30;
  CapTableBuilder *in_stack_fffffffffffffd38;
  void *in_stack_fffffffffffffd40;
  WirePointer *in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  StructBuilder local_2a8;
  StructBuilder local_280;
  SegmentReader *local_258;
  CapTableReader *pCStack_250;
  void *local_248;
  WirePointer *pWStack_240;
  StructDataBitCount local_238;
  StructPointerCount SStack_234;
  undefined2 uStack_232;
  int iStack_230;
  undefined4 uStack_22c;
  SegmentReader *local_228;
  CapTableReader *pCStack_220;
  void *local_218;
  WirePointer *pWStack_210;
  StructDataBitCount local_208;
  StructPointerCount SStack_204;
  undefined2 uStack_202;
  int iStack_200;
  undefined4 uStack_1fc;
  MallocMessageBuilder local_1f8;
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_348,&local_108.super_MessageBuilder);
  local_1f8.super_MessageBuilder.arenaSpace[1] = local_348.data;
  local_1f8.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)local_348.segment;
  local_1f8.super_MessageBuilder.arenaSpace[0] = local_348.capTable;
  PointerBuilder::getStruct
            (&local_310,(PointerBuilder *)&local_1f8,(StructSize)0x140006,(word *)0x0);
  builder_00._builder.capTable = in_stack_fffffffffffffd38;
  builder_00._builder.segment = in_stack_fffffffffffffd30;
  builder_00._builder.data = in_stack_fffffffffffffd40;
  builder_00._builder.pointers = in_stack_fffffffffffffd48;
  builder_00._builder.dataSize = (StructDataBitCount)in_stack_fffffffffffffd50;
  builder_00._builder.pointerCount = SUB82(in_stack_fffffffffffffd50,4);
  builder_00._builder._38_2_ = SUB82(in_stack_fffffffffffffd50,6);
  initTestMessage(builder_00);
  MallocMessageBuilder::MallocMessageBuilder(&local_1f8,0x400,GROW_HEURISTICALLY);
  StructBuilder::asReader(&local_310);
  MessageBuilder::getRootInternal(&local_2e8,&local_1f8.super_MessageBuilder);
  local_348.dataSize = local_378.dataSize;
  local_348.pointerCount = local_378.pointerCount;
  local_348._38_2_ = local_378._38_2_;
  local_348.nestingLimit = iStack_350;
  local_348._44_4_ = uStack_34c;
  local_348.data = local_378.data;
  local_348.pointers = local_378.pointers;
  local_348.segment = &(local_378.segment)->super_SegmentReader;
  local_348.capTable = &(local_378.capTable)->super_CapTableReader;
  local_398.pointer = local_2e8.builder.pointer;
  local_398.segment = local_2e8.builder.segment;
  local_398.capTable = local_2e8.builder.capTable;
  PointerBuilder::setStruct(&local_398,&local_348,false);
  MessageBuilder::getRootInternal((Builder *)&local_378,&local_1f8.super_MessageBuilder);
  local_348.data = local_378.data;
  local_348.segment = &(local_378.segment)->super_SegmentReader;
  local_348.capTable = &(local_378.capTable)->super_CapTableReader;
  PointerBuilder::getStruct
            (&local_280,(PointerBuilder *)&local_348,(StructSize)0x140006,(word *)0x0);
  checkTestMessage((Builder)in_stack_00000140);
  MallocMessageBuilder::~MallocMessageBuilder(&local_1f8);
  MallocMessageBuilder::MallocMessageBuilder(&local_1f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_398,&local_1f8.super_MessageBuilder);
  local_348.data = local_398.pointer;
  local_348.segment = &(local_398.segment)->super_SegmentReader;
  local_348.capTable = &(local_398.capTable)->super_CapTableReader;
  PointerBuilder::getStruct
            (&local_378,(PointerBuilder *)&local_348,(StructSize)0x140006,(word *)0x0);
  StructBuilder::asReader(&local_310);
  local_348.dataSize = local_208;
  local_348.pointerCount = SStack_204;
  local_348._38_2_ = uStack_202;
  local_348.nestingLimit = iStack_200;
  local_348._44_4_ = uStack_1fc;
  local_348.data = local_218;
  local_348.pointers = pWStack_210;
  local_348.segment = local_228;
  local_348.capTable = pCStack_220;
  local_398.pointer = local_378.pointers + 2;
  local_398.segment = local_378.segment;
  local_398.capTable = local_378.capTable;
  PointerBuilder::setStruct(&local_398,&local_348,false);
  local_348.data = local_378.pointers + 2;
  local_348.segment = &(local_378.segment)->super_SegmentReader;
  local_348.capTable = &(local_378.capTable)->super_CapTableReader;
  PointerBuilder::getStruct
            (&local_2a8,(PointerBuilder *)&local_348,(StructSize)0x140006,(word *)0x0);
  checkTestMessage((Builder)in_stack_00000140);
  MallocMessageBuilder::~MallocMessageBuilder(&local_1f8);
  MallocMessageBuilder::MallocMessageBuilder(&local_1f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_398,&local_1f8.super_MessageBuilder);
  local_348.data = local_398.pointer;
  local_348.segment = &(local_398.segment)->super_SegmentReader;
  local_348.capTable = &(local_398.capTable)->super_CapTableReader;
  PointerBuilder::getStruct(&local_378,(PointerBuilder *)&local_348,(StructSize)0x10000,(word *)0x0)
  ;
  pWVar3 = local_378.pointers;
  pCVar2 = local_378.capTable;
  pSVar1 = local_378.segment;
  StructBuilder::asReader(&local_310);
  local_348.dataSize = local_238;
  local_348.pointerCount = SStack_234;
  local_348._38_2_ = uStack_232;
  local_348.nestingLimit = iStack_230;
  local_348._44_4_ = uStack_22c;
  local_348.data = local_248;
  local_348.pointers = pWStack_240;
  local_348.segment = local_258;
  local_348.capTable = pCStack_250;
  local_398.segment = pSVar1;
  local_398.capTable = pCVar2;
  local_398.pointer = pWVar3;
  PointerBuilder::setStruct(&local_398,&local_348,false);
  local_348.segment = &(local_378.segment)->super_SegmentReader;
  local_348.capTable = &(local_378.capTable)->super_CapTableReader;
  local_348.data = local_378.pointers;
  PointerBuilder::getStruct
            ((StructBuilder *)&stack0xfffffffffffffd30,(PointerBuilder *)&local_348,
             (StructSize)0x140006,(word *)0x0);
  checkTestMessage((Builder)in_stack_00000140);
  MallocMessageBuilder::~MallocMessageBuilder(&local_1f8);
  MallocMessageBuilder::~MallocMessageBuilder(&local_108);
  return;
}

Assistant:

TEST(Encoding, StructSetters) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<TestAllTypes>();
  initTestMessage(root);

  {
    MallocMessageBuilder builder2;
    builder2.setRoot(root.asReader());
    checkTestMessage(builder2.getRoot<TestAllTypes>());
  }

  {
    MallocMessageBuilder builder2;
    auto root2 = builder2.getRoot<TestAllTypes>();
    root2.setStructField(root);
    checkTestMessage(root2.getStructField());
  }

  {
    MallocMessageBuilder builder2;
    auto root2 = builder2.getRoot<test::TestAnyPointer>();
    root2.getAnyPointerField().setAs<test::TestAllTypes>(root);
    checkTestMessage(root2.getAnyPointerField().getAs<test::TestAllTypes>());
  }
}